

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

void do_undo_last_proc(Am_Object *cmd)

{
  Am_Value *value;
  Am_Object local_50;
  Am_Object local_48;
  undefined1 local_40 [8];
  Am_Object_Method undoit;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object undo_handler;
  Am_Object *cmd_local;
  
  undo_handler.data = (Am_Object_Data *)cmd;
  Am_Object::Am_Object(&local_20,cmd);
  get_undo_handler(&local_18);
  Am_Object::~Am_Object(&local_20);
  Am_Object_Method::Am_Object_Method((Am_Object_Method *)local_40);
  value = Am_Object::Get(&local_18,0x176,0);
  Am_Object_Method::operator=((Am_Object_Method *)local_40,value);
  Am_Object::Am_Object(&local_48,&local_18);
  (*(code *)undoit.from_wrapper)(&local_48);
  Am_Object::~Am_Object(&local_48);
  Am_Object::Am_Object(&local_50,cmd);
  mark_changed_command_to_undo(&local_50);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_undo_last, (Am_Object cmd))
{
  Am_Object undo_handler = get_undo_handler(cmd);
  Am_Object_Method undoit;
  undoit = undo_handler.Get(Am_PERFORM_UNDO);
  undoit.Call(undo_handler);
  mark_changed_command_to_undo(cmd);
}